

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movDemuxer.cpp
# Opt level: O0

void __thiscall
MovParsedAudioTrackData::setPrivData(MovParsedAudioTrackData *this,uint8_t *buff,int size)

{
  int size_local;
  uint8_t *buff_local;
  MovParsedAudioTrackData *this_local;
  
  this->m_buff = buff;
  this->m_size = size;
  (this->m_aacRaw).m_channels = (uint8_t)this->m_sc->channels;
  (this->m_aacRaw).m_sample_rate = this->m_sc->sample_rate;
  (this->m_aacRaw).m_id = 1;
  (this->m_aacRaw).m_profile = '\0';
  if (0 < size) {
    (this->m_aacRaw).m_profile = (char)((int)(uint)*buff >> 3) + 0xff;
  }
  (this->m_aacRaw).m_layer = 0;
  (this->m_aacRaw).m_rdb = '\0';
  return;
}

Assistant:

void setPrivData(uint8_t* buff, const int size) override
    {
        m_buff = buff;
        m_size = size;
        m_aacRaw.m_channels = static_cast<uint8_t>(m_sc->channels);
        m_aacRaw.m_sample_rate = m_sc->sample_rate;
        m_aacRaw.m_id = 1;  // MPEG2
        m_aacRaw.m_profile = 0;
        if (size > 0)
            m_aacRaw.m_profile = (buff[0] >> 3) - 1;
        m_aacRaw.m_layer = 0;
        m_aacRaw.m_rdb = 0;
    }